

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_heap.c
# Opt level: O3

void * load_image_fn(sexp ctx,sexp dl,sexp name)

{
  char *pcVar1;
  sexp psVar2;
  sexp psVar3;
  long lVar4;
  int iVar5;
  sexp psVar6;
  void *pvVar7;
  size_t __n;
  long in_RCX;
  long lVar8;
  sexp_proc2 p_Var9;
  char *__s1;
  char *pcVar10;
  
  lVar8 = (long)&name->value + in_RCX + 8;
  if ((((ulong)dl & 3) == 0 && dl != (sexp)0x0) && (dl->tag == 0x1a)) {
    psVar6 = (dl->value).type.cpl;
    if (psVar6 == (sexp)0x0) {
      psVar6 = (dl->value).type.name;
      psVar2 = (psVar6->value).type.name;
      psVar3 = (psVar6->value).type.cpl;
      __s1 = (psVar2->value).flonum_bits + (long)(psVar3->value).flonum_bits;
      psVar6 = (sexp)dlopen(__s1,1);
      (dl->value).type.cpl = psVar6;
      if (psVar6 == (sexp)0x0) {
        p_Var9 = (((ctx->value).type.setters)->value).type.finalize;
        if (((ulong)p_Var9 & 3) == 0) {
          do {
            if (*(int *)p_Var9 != 6) break;
            lVar4 = *(long *)(p_Var9 + 8);
            pcVar10 = (char *)(*(long *)(lVar4 + 8) + *(long *)(lVar4 + 0x10) + 0x10);
            __n = strlen(pcVar10);
            iVar5 = strncmp(__s1,pcVar10,__n);
            if (iVar5 == 0) {
              pcVar10 = (psVar2->value).flonum_bits +
                        (long)(&psVar3->field_0x7 + *(long *)(lVar4 + 0x18));
              do {
                pcVar1 = pcVar10 + 1;
                pcVar10 = pcVar10 + 1;
              } while (*pcVar1 == '/');
              pcVar10 = sexp_find_module_file_raw(ctx,pcVar10);
              if (pcVar10 != (char *)0x0) {
                psVar6 = (sexp)dlopen(pcVar10,1);
                (dl->value).type.cpl = psVar6;
                free(pcVar10);
                psVar6 = (dl->value).type.cpl;
                if (psVar6 != (sexp)0x0) goto LAB_0011edf3;
              }
            }
            p_Var9 = *(sexp_proc2 *)(p_Var9 + 0x10);
          } while (((ulong)p_Var9 & 3) == 0);
          psVar6 = (dl->value).type.cpl;
          if (psVar6 != (sexp)0x0) goto LAB_0011edf3;
        }
        psVar6 = (dl->value).type.name;
        snprintf(gc_heap_err_str,0x100,"dlopen failure: %s",
                 (long)&((psVar6->value).type.cpl)->value +
                 (long)&((psVar6->value).type.name)->value);
        return (void *)0x0;
      }
    }
  }
  else {
    psVar6 = (sexp)0x0;
  }
LAB_0011edf3:
  pvVar7 = (void *)dlsym(psVar6,lVar8);
  if (pvVar7 == (void *)0x0) {
    pvVar7 = (void *)0x0;
    snprintf(gc_heap_err_str,0x100,"dynamic function lookup failure: %s %s","<static>",lVar8);
  }
  return pvVar7;
}

Assistant:

static void* load_image_fn(sexp ctx, sexp dl, sexp name) {
  sexp ls;
  void *fn = NULL;
  char *file_name, *rel_name=NULL, *new_file_name;
  char *handle_name = "<static>";
  char *symbol_name = sexp_string_data(name);
  if (dl && sexp_dlp(dl)) {
    if (!sexp_dl_handle(dl)) {
      /* try exact file, then the search path */
      file_name = sexp_string_data(sexp_dl_file(dl));
      sexp_dl_handle(dl) = dlopen(file_name, RTLD_LAZY);
      if (!sexp_dl_handle(dl)) {
        for (ls = sexp_global(ctx, SEXP_G_MODULE_PATH); sexp_pairp(ls); ls=sexp_cdr(ls)) {
          if (strstr(file_name, sexp_string_data(sexp_car(ls))) == file_name) {
            rel_name = file_name + sexp_string_size(sexp_car(ls));
            while (*rel_name == '/')
              ++rel_name;
            new_file_name = sexp_find_module_file_raw(ctx, rel_name);
            if (new_file_name) {
              sexp_dl_handle(dl) = dlopen(new_file_name, RTLD_LAZY);
              free(new_file_name);
              if (sexp_dl_handle(dl))
                break;
            }
          }
        }
        if (!sexp_dl_handle(dl)) {
          handle_name = sexp_string_data(sexp_dl_file(dl));
          snprintf(gc_heap_err_str, ERR_STR_SIZE, "dlopen failure: %s",
                   handle_name);
          return NULL;
        }
      }
    }
    fn = dlsym(sexp_dl_handle(dl), symbol_name);
  } else {
    fn = dlsym(SEXP_RTLD_DEFAULT, symbol_name);
  }
  if (!fn) {
    snprintf(gc_heap_err_str, ERR_STR_SIZE,
             "dynamic function lookup failure: %s %s",
             handle_name, symbol_name);
  }
  return fn;
}